

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CConnman::NotifyNumConnectionsChanged(CConnman *this)

{
  size_type sVar1;
  long in_RDI;
  long in_FS_OFFSET;
  AnnotatedMixin<std::recursive_mutex> *unaff_retaddr;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_00000008;
  size_t nodes_size;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock65;
  CClientUIInterface *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffeb;
  int in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  char *pszName;
  
  pszName = *(char **)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffffc8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_00000008,unaff_retaddr,pszName,in_stack_fffffffffffffff0,
             in_stack_ffffffffffffffec,(bool)in_stack_ffffffffffffffeb);
  sVar1 = std::vector<CNode_*,_std::allocator<CNode_*>_>::size
                    ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_ffffffffffffffc8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffffc8);
  if ((sVar1 != *(uint *)(in_RDI + 0x1d8)) &&
     (*(int *)(in_RDI + 0x1d8) = (int)sVar1, *(long *)(in_RDI + 0x260) != 0)) {
    CClientUIInterface::NotifyNumConnectionsChanged(in_stack_ffffffffffffffc8,0);
  }
  if (*(char **)(in_FS_OFFSET + 0x28) != pszName) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::NotifyNumConnectionsChanged()
{
    size_t nodes_size;
    {
        LOCK(m_nodes_mutex);
        nodes_size = m_nodes.size();
    }
    if(nodes_size != nPrevNodeCount) {
        nPrevNodeCount = nodes_size;
        if (m_client_interface) {
            m_client_interface->NotifyNumConnectionsChanged(nodes_size);
        }
    }
}